

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix.cc
# Opt level: O3

void helix_session_subscribe(helix_session_t session,char *symbol,size_t max_orders)

{
  allocator local_39;
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::string((string *)local_38,symbol,&local_39);
  (**(code **)(*(long *)session + 0x18))(session,(string *)local_38,max_orders);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void helix_session_subscribe(helix_session_t session, const char *symbol, size_t max_orders)
{
    unwrap(session)->subscribe(symbol, max_orders);
}